

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O0

void nn_xrespondent_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_hash *self_00;
  nn_pipe *in_RSI;
  nn_hash_item *in_RDI;
  nn_xrespondent_data *data;
  nn_xrespondent *xrespondent;
  
  if (in_RDI == (nn_hash_item *)0x0) {
    in_RDI = (nn_hash_item *)0x0;
  }
  self_00 = (nn_hash *)nn_pipe_getdata(in_RSI);
  nn_fq_rm((nn_fq *)self_00,(nn_fq_data *)in_RDI);
  nn_hash_erase(self_00,in_RDI);
  nn_hash_item_term((nn_hash_item *)0x1430dd);
  nn_free((void *)0x1430e7);
  return;
}

Assistant:

void nn_xrespondent_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xrespondent->inpipes, &data->initem);
    nn_hash_erase (&xrespondent->outpipes, &data->outitem);
    nn_hash_item_term (&data->outitem);

    nn_free (data);
}